

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

void SGParser::Generator::FollowPos
               (RegExprDFANode *node,vector<unsigned_int,_std::allocator<unsigned_int>_> *nodelist)

{
  pointer __s2;
  pointer puVar1;
  pointer __s1;
  pointer puVar2;
  pointer ppRVar3;
  bool bVar4;
  int iVar5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var6
  ;
  RegExprDFANode *pRVar7;
  RegExprDFANode *pRVar8;
  
  pRVar8 = node->pParent;
  if (pRVar8 != (RegExprDFANode *)0x0) {
    bVar4 = false;
    do {
      __s2 = (node->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
      puVar1 = (node->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        __s1 = (pRVar8->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (pRVar8->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (((long)puVar2 - (long)__s1 != (long)puVar1 - (long)__s2) ||
           ((puVar2 != __s1 && (iVar5 = bcmp(__s1,__s2,(long)puVar2 - (long)__s1), iVar5 != 0))))
        break;
        pRVar8 = pRVar8->pParent;
        if (pRVar8 == (RegExprDFANode *)0x0 || bVar4) {
          return;
        }
      }
      if (pRVar8->Type == Star) {
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                          (__s1,puVar2,&node->Position);
        pRVar7 = pRVar8;
        if (_Var6._M_current !=
            (pRVar8->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_0013daa9;
LAB_0013dac0:
        bVar4 = true;
      }
      else if (pRVar8->Type == And) {
        pRVar7 = *(pRVar8->Children).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                          ((pRVar7->LastPos).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           *(pointer *)
                            ((long)&(pRVar7->LastPos).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + 8),&node->Position);
        ppRVar3 = (pRVar8->Children).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (_Var6._M_current ==
            *(pointer *)
             ((long)&((*ppRVar3)->LastPos).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8))
        goto LAB_0013dac0;
        pRVar7 = ppRVar3[1];
LAB_0013daa9:
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)nodelist,
                   (nodelist->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (pRVar7->FirstPos).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pRVar7->FirstPos).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      pRVar8 = pRVar8->pParent;
    } while ((pRVar8 != (RegExprDFANode *)0x0) && (!bVar4));
  }
  return;
}

Assistant:

void FollowPos(const RegExprDFANode& node, std::vector<unsigned>& nodelist) {
    bool done  = false;
    auto pnode = node.pParent;

    while (pnode && !done) {
        if (pnode->LastPos == node.LastPos) {
            pnode = pnode->pParent;
            continue;
        }

        switch (pnode->Type) {
            case RegExprDFANode::NodeType::And:
                if (std::find(pnode->Children[0u]->LastPos.begin(),
                              pnode->Children[0u]->LastPos.end(), node.Position) !=
                    pnode->Children[0u]->LastPos.end())
                    nodelist.insert(nodelist.end(), pnode->Children[1u]->FirstPos.begin(),
                                    pnode->Children[1u]->FirstPos.end());
                else
                    done = true;
                break;

            case RegExprDFANode::NodeType::Star:
                if (std::find(pnode->LastPos.begin(), pnode->LastPos.end(), node.Position) !=
                    pnode->LastPos.end())
                    nodelist.insert(nodelist.end(), pnode->FirstPos.begin(),
                                    pnode->FirstPos.end());
                else
                    done = true;
                break;

            default:
                break;
        }

        pnode = pnode->pParent;
    }
}